

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_cstring.hpp
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
boost::unit_test::operator+
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *lhs,
          basic_cstring<const_char> *rhs)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)lhs);
  std::__cxx11::string::append<char_const*,void>
            ((string *)__return_storage_ptr__,rhs->m_begin,rhs->m_end);
  return __return_storage_ptr__;
}

Assistant:

inline std::basic_string<CharT1>
operator+( std::basic_string<CharT1> const& lhs, basic_cstring<CharT2> const& rhs )
{
    std::basic_string<CharT1> res( lhs );

    res.append( rhs.begin(), rhs.end() );
    return res;
}